

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

cram_container * cram_next_container(cram_fd *fd,bam_seq_t *b)

{
  int iVar1;
  cram_slice *pcVar2;
  int local_34;
  int i;
  cram_slice *s;
  cram_container *c;
  bam_seq_t *b_local;
  cram_fd *fd_local;
  
  s = (cram_slice *)fd->ctr;
  if (((cram_container *)s)->curr_ref == -2) {
    ((cram_container *)s)->curr_ref = (b->core).tid;
  }
  if (((cram_container *)s)->slice != (cram_slice *)0x0) {
    pcVar2 = ((cram_container *)s)->slice;
    if (((cram_container *)s)->multi_seq == 0) {
      pcVar2->hdr->ref_seq_id = ((cram_container *)s)->curr_ref;
      pcVar2->hdr->ref_seq_start = ((cram_container *)s)->first_base;
      pcVar2->hdr->ref_seq_span =
           (((cram_container *)s)->last_base - ((cram_container *)s)->first_base) + 1;
    }
    else {
      pcVar2->hdr->ref_seq_id = -2;
      pcVar2->hdr->ref_seq_start = 0;
      pcVar2->hdr->ref_seq_span = 0;
    }
    pcVar2->hdr->num_records = ((cram_container *)s)->curr_rec;
    if (((cram_container *)s)->curr_slice == 0) {
      if (((cram_container *)s)->ref_seq_id != pcVar2->hdr->ref_seq_id) {
        ((cram_container *)s)->ref_seq_id = pcVar2->hdr->ref_seq_id;
      }
      ((cram_container *)s)->ref_seq_start = ((cram_container *)s)->first_base;
    }
    ((cram_container *)s)->curr_slice = ((cram_container *)s)->curr_slice + 1;
  }
  if ((((cram_container *)s)->curr_slice == ((cram_container *)s)->max_slice) ||
     (((b->core).tid != ((cram_container *)s)->curr_ref && (((cram_container *)s)->multi_seq == 0)))
     ) {
    ((cram_container *)s)->ref_seq_span = (fd->last_base - ((cram_container *)s)->ref_seq_start) + 1
    ;
    if (fd->verbose != 0) {
      fprintf(_stderr,"Flush container %d/%d..%d\n",(ulong)(uint)((cram_container *)s)->ref_seq_id,
              (ulong)(uint)((cram_container *)s)->ref_seq_start,
              (ulong)((((cram_container *)s)->ref_seq_start + ((cram_container *)s)->ref_seq_span) -
                     1));
    }
    if (fd->pool == (t_pool *)0x0) {
      iVar1 = cram_flush_container(fd,(cram_container *)s);
      if (iVar1 == -1) {
        return (cram_container *)0x0;
      }
      for (local_34 = 0; local_34 < ((cram_container *)s)->max_slice; local_34 = local_34 + 1) {
        cram_free_slice(((cram_container *)s)->slices[local_34]);
        ((cram_container *)s)->slices[local_34] = (cram_slice *)0x0;
      }
      ((cram_container *)s)->slice = (cram_slice *)0x0;
      ((cram_container *)s)->curr_slice = 0;
      cram_free_container((cram_container *)s);
    }
    else {
      iVar1 = cram_flush_container_mt(fd,(cram_container *)s);
      if (iVar1 == -1) {
        return (cram_container *)0x0;
      }
    }
    s = (cram_slice *)cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
    fd->ctr = (cram_container *)s;
    if ((cram_container *)s == (cram_container *)0x0) {
      return (cram_container *)0x0;
    }
    ((cram_container *)s)->record_counter = fd->record_counter;
    ((cram_container *)s)->curr_ref = (b->core).tid;
  }
  iVar1 = (b->core).pos + 1;
  *(int *)((long)&s->aux_BD_blk + 4) = iVar1;
  *(int *)&s->aux_BD_blk = iVar1;
  *(int *)&s->qual_blk = iVar1;
  pcVar2 = cram_new_slice(MAPPED_SLICE,s->nTN);
  *(cram_slice **)(&s->base_blk->method + (long)*(int *)((long)&s->TN + 4) * 2) = pcVar2;
  s->soft_blk = (cram_block *)pcVar2;
  if (s->soft_blk == (cram_block *)0x0) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    if (*(int *)((long)&s->aux_OQ_blk + 4) == 0) {
      *(int32_t *)(*(long *)s->soft_blk + 4) = (b->core).tid;
      *(int32_t *)(*(long *)s->soft_blk + 8) = (b->core).pos + 1;
      *(int32_t *)&s->soft_blk->data = (b->core).pos + 1;
    }
    else {
      *(undefined4 *)(*(long *)s->soft_blk + 4) = 0xfffffffe;
      *(undefined4 *)(*(long *)s->soft_blk + 8) = 0;
      *(undefined4 *)&s->soft_blk->data = 1;
    }
    s->aTN = 0;
    fd_local = (cram_fd *)s;
  }
  return (cram_container *)fd_local;
}

Assistant:

static cram_container *cram_next_container(cram_fd *fd, bam_seq_t *b) {
    cram_container *c = fd->ctr;
    cram_slice *s;
    int i;

    /* First occurence */
    if (c->curr_ref == -2)
	c->curr_ref = bam_ref(b);

    if (c->slice) {
	s = c->slice;
	if (c->multi_seq) {
	    s->hdr->ref_seq_id    = -2;
	    s->hdr->ref_seq_start = 0;
	    s->hdr->ref_seq_span  = 0;
	} else {
	    s->hdr->ref_seq_id    = c->curr_ref;
	    s->hdr->ref_seq_start = c->first_base;
	    s->hdr->ref_seq_span  = c->last_base - c->first_base + 1;
	}
	s->hdr->num_records   = c->curr_rec;

	if (c->curr_slice == 0) {
	    if (c->ref_seq_id != s->hdr->ref_seq_id)
		c->ref_seq_id  = s->hdr->ref_seq_id;
	    c->ref_seq_start = c->first_base;
	}

	c->curr_slice++;
    }

    /* Flush container */
    if (c->curr_slice == c->max_slice ||
	(bam_ref(b) != c->curr_ref && !c->multi_seq)) {
	c->ref_seq_span = fd->last_base - c->ref_seq_start + 1;
	if (fd->verbose)
	    fprintf(stderr, "Flush container %d/%d..%d\n",
		    c->ref_seq_id, c->ref_seq_start,
		    c->ref_seq_start + c->ref_seq_span -1);

	/* Encode slices */
	if (fd->pool) {
	    if (-1 == cram_flush_container_mt(fd, c))
		return NULL;
	} else {
	    if (-1 == cram_flush_container(fd, c))
		return NULL;

	    // Move to sep func, as we need cram_flush_container for
	    // the closing phase to flush the partial container.
	    for (i = 0; i < c->max_slice; i++) {
		cram_free_slice(c->slices[i]);
		c->slices[i] = NULL;
	    }

	    c->slice = NULL;
	    c->curr_slice = 0;

	    /* Easy approach for purposes of freeing stats */
	    cram_free_container(c);
	}

	c = fd->ctr = cram_new_container(fd->seqs_per_slice,
					 fd->slices_per_container);
	if (!c)
	    return NULL;
	c->record_counter = fd->record_counter;
	c->curr_ref = bam_ref(b);
    }

    c->last_pos = c->first_base = c->last_base = bam_pos(b)+1;

    /* New slice */
    c->slice = c->slices[c->curr_slice] =
	cram_new_slice(MAPPED_SLICE, c->max_rec);
    if (!c->slice)
	return NULL;

    if (c->multi_seq) {
	c->slice->hdr->ref_seq_id = -2;
	c->slice->hdr->ref_seq_start = 0;
	c->slice->last_apos = 1;
    } else {
	c->slice->hdr->ref_seq_id = bam_ref(b);
	// wrong for unsorted data, will fix during encoding.
	c->slice->hdr->ref_seq_start = bam_pos(b)+1;
	c->slice->last_apos = bam_pos(b)+1;
    }

    c->curr_rec = 0;

    return c;
}